

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test
::TestBody(MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  char *message;
  AssertHelper local_3d8;
  Message local_3d0;
  string local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar;
  MessageDifferencer differencer;
  string_view local_1d8;
  string_view local_1c8;
  FieldDescriptor *local_1b8;
  FieldDescriptor *double_nested_desc;
  FieldDescriptor *nested_desc;
  FieldDescriptor *desc;
  TestField *field;
  Item *item;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  pDVar2 = proto2_unittest::TestDiffMessage::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"item");
  nested_desc = Descriptor::FindFieldByName(pDVar2,local_1c8);
  pDVar2 = FieldDescriptor::message_type(nested_desc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"rm");
  double_nested_desc = Descriptor::FindFieldByName(pDVar2,local_1d8);
  pDVar2 = FieldDescriptor::message_type(double_nested_desc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&differencer.unpack_any_field_,"rc"
            );
  local_1b8 = Descriptor::FindFieldByName(pDVar2,stack0xfffffffffffffe18);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar.message_);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)&gtest_ar.message_,nested_desc);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)&gtest_ar.message_,double_nested_desc);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)&gtest_ar.message_,local_1b8);
  field = (TestField *)
          proto2_unittest::TestDiffMessage::add_item
                    ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,1);
  proto2_unittest::TestField::add_rc((TestField *)desc,2);
  proto2_unittest::TestField::add_rc((TestField *)desc,3);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,4);
  proto2_unittest::TestField::add_rc((TestField *)desc,5);
  proto2_unittest::TestField::add_rc((TestField *)desc,6);
  proto2_unittest::TestField::add_rc((TestField *)desc,7);
  field = (TestField *)proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_180);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,4);
  proto2_unittest::TestField::add_rc((TestField *)desc,7);
  proto2_unittest::TestField::add_rc((TestField *)desc,6);
  proto2_unittest::TestField::add_rc((TestField *)desc,5);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,1);
  proto2_unittest::TestField::add_rc((TestField *)desc,3);
  proto2_unittest::TestField::add_rc((TestField *)desc,2);
  field = (TestField *)
          proto2_unittest::TestDiffMessage::add_item
                    ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,8);
  proto2_unittest::TestField::add_rc((TestField *)desc,10);
  proto2_unittest::TestField::add_rc((TestField *)desc,0xb);
  proto2_unittest::TestField::add_rc((TestField *)desc,9);
  field = (TestField *)proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_180);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,8);
  proto2_unittest::TestField::add_rc((TestField *)desc,9);
  proto2_unittest::TestField::add_rc((TestField *)desc,10);
  proto2_unittest::TestField::add_rc((TestField *)desc,0xb);
  protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
            (&local_3c8,this,(MessageDifferencer *)&gtest_ar.message_,
             (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180,true);
  testing::internal::EqHelper::
  Compare<char[876],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3a8,
             "\"matched: item[0].rm[0].c -> item[0].rm[1].c : 1\\n\" \"moved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\\n\" \"moved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\\n\" \"moved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\\n\" \"matched: item[0].rm[1].c -> item[0].rm[0].c : 4\\n\" \"moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\\n\" \"matched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\\n\" \"moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\\n\" \"moved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\\n\" \"matched: item[0] : { rm { c: 1 rc: 2 rc: 3 }\" \" rm { c: 4 rc: 5 rc: 6 rc: 7 } }\\n\" \"matched: item[1].rm[0].c : 8\\n\" \"moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\\n\" \"moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\\n\" \"moved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\\n\" \"matched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\\n\" \"matched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\\n\""
             ,"RunWithResult(&differencer, msg1, msg2, true)",
             (char (*) [876])
             "matched: item[0].rm[0].c -> item[0].rm[1].c : 1\nmoved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\nmoved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\nmoved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\nmatched: item[0].rm[1].c -> item[0].rm[0].c : 4\nmoved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\nmatched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\nmoved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\nmoved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\nmatched: item[0] : { rm { c: 1 rc: 2 rc: 3 } rm { c: 4 rc: 5 rc: 6 rc: 7 } }\nmatched: item[1].rm[0].c : 8\nmoved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\nmoved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\nmoved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\nmatched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\nmatched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\n"
             ,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1021,message);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar.message_);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST_F(MatchingTest, MatchesAppearInPostTraversalOrderForMovedFields) {
  proto2_unittest::TestDiffMessage msg1, msg2;
  proto2_unittest::TestDiffMessage::Item* item;
  proto2_unittest::TestField* field;

  const FieldDescriptor* desc;
  const FieldDescriptor* nested_desc;
  const FieldDescriptor* double_nested_desc;
  desc = msg1.GetDescriptor()->FindFieldByName("item");
  nested_desc = desc->message_type()->FindFieldByName("rm");
  double_nested_desc = nested_desc->message_type()->FindFieldByName("rc");
  MessageDifferencer differencer;
  differencer.TreatAsSet(desc);
  differencer.TreatAsSet(nested_desc);
  differencer.TreatAsSet(double_nested_desc);

  item = msg1.add_item();
  field = item->add_rm();
  field->set_c(1);
  field->add_rc(2);
  field->add_rc(3);
  field = item->add_rm();
  field->set_c(4);
  field->add_rc(5);
  field->add_rc(6);
  field->add_rc(7);
  item = msg2.add_item();
  field = item->add_rm();
  field->set_c(4);
  field->add_rc(7);
  field->add_rc(6);
  field->add_rc(5);
  field = item->add_rm();
  field->set_c(1);
  field->add_rc(3);
  field->add_rc(2);
  item = msg1.add_item();
  field = item->add_rm();
  field->set_c(8);
  field->add_rc(10);
  field->add_rc(11);
  field->add_rc(9);
  item = msg2.add_item();
  field = item->add_rm();
  field->set_c(8);
  field->add_rc(9);
  field->add_rc(10);
  field->add_rc(11);

  EXPECT_EQ(
      "matched: item[0].rm[0].c -> item[0].rm[1].c : 1\n"
      "moved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\n"
      "moved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\n"
      "moved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\n"
      "matched: item[0].rm[1].c -> item[0].rm[0].c : 4\n"
      "moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\n"
      "matched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\n"
      "moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\n"
      "moved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\n"
      "matched: item[0] : { rm { c: 1 rc: 2 rc: 3 }"
      " rm { c: 4 rc: 5 rc: 6 rc: 7 } }\n"
      "matched: item[1].rm[0].c : 8\n"
      "moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\n"
      "moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\n"
      "moved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\n"
      "matched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\n"
      "matched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\n",
      RunWithResult(&differencer, msg1, msg2, true));
}